

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubdirectoryDisposer.cpp
# Opt level: O2

void __thiscall
ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer(SubdirectoryDisposer *this)

{
  string *psVar1;
  
  psVar1 = (string *)ApprovalTestNamer::testConfiguration();
  ::std::__cxx11::string::_M_assign(psVar1);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SubdirectoryDisposer::~SubdirectoryDisposer()
    {
        ApprovalTestNamer::testConfiguration().subdirectory = previous_result;
    }